

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O3

void column_test_boundary_z2_operators<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>
               (vector<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
                *matrix)

{
  ulong *puVar1;
  undefined4 uVar2;
  uint uVar3;
  pointer pUVar4;
  _Hash_node_base *p_Var5;
  __buckets_ptr pp_Var6;
  bool bVar7;
  _Hash_node_base *p_Var8;
  _Hash_node_base *p_Var9;
  __node_base _Var10;
  uint uVar11;
  __hashtable *__h_4;
  size_type sVar12;
  Column_dimension_option CVar13;
  __hashtable *__h_1;
  __hashtable *__h;
  Column_support *pCVar14;
  __buckets_ptr pp_Var15;
  undefined1 auVar16 [8];
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  pair<std::__detail::_Node_iterator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_true,_true>,_bool>
  pVar17;
  _Bit_const_iterator __first1;
  _Bit_const_iterator __first1_00;
  _Bit_const_iterator __first1_01;
  _Bit_const_iterator __first1_02;
  _Bit_const_iterator __first1_03;
  _Bit_const_iterator __first1_04;
  _Bit_const_iterator __last1;
  _Bit_const_iterator __last1_00;
  _Bit_const_iterator __last1_01;
  _Bit_const_iterator __last1_02;
  _Bit_const_iterator __last1_03;
  _Bit_const_iterator __last1_04;
  _Bit_const_iterator __first2;
  _Bit_const_iterator __first2_00;
  _Bit_const_iterator __first2_01;
  _Bit_const_iterator __first2_02;
  _Bit_const_iterator __first2_03;
  _Bit_const_iterator __first2_04;
  Column_settings settings;
  undefined1 local_4a8 [8];
  _Hash_node_base *p_Stack_4a0;
  shared_count sStack_498;
  undefined8 local_490;
  _Bit_pointer local_488;
  void *local_478;
  undefined4 local_470;
  long local_468;
  uint local_460;
  long local_458;
  _Hash_node_base local_450;
  _Hash_node_base local_448;
  char *pcStack_440;
  shared_count sStack_438;
  _Hash_node_base *local_430;
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
  col4;
  _Hash_node_base local_3d0;
  char *local_3c8;
  shared_count sStack_3c0;
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
  col2;
  _Hash_node_base local_358;
  char *local_350;
  shared_count sStack_348;
  char *local_340;
  _Hash_node_base local_338;
  char *local_330;
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
  col3;
  _Hash_node_base local_2d0;
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
  col1;
  _Hash_node_base local_270;
  undefined1 local_264 [4];
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>
  col0;
  char *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  undefined1 *local_170;
  undefined1 *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  undefined1 *local_f0;
  undefined1 *local_e8;
  char *local_e0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  char *local_a8;
  undefined1 *local_a0;
  undefined1 *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_478 = (void *)0x0;
  local_470 = 0;
  local_468 = 0;
  local_460 = 0;
  local_458 = 0;
  col2.super_Column_dimension_option.dim_ = 0;
  col2._4_4_ = 1;
  col2.column_._M_h._M_buckets = (__buckets_ptr)0x500000002;
  col2.column_._M_h._M_bucket_count._0_4_ = 6;
  __l._M_len = 5;
  __l._M_array = (iterator)&col2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col1,__l,
             (allocator_type *)&local_448);
  sVar12 = (long)col1.column_._M_h._M_buckets - col1._0_8_ >> 2;
  col0.super_Column_dimension_option.dim_ = (int)sVar12 + -1;
  if (col1.column_._M_h._M_buckets == (__buckets_ptr)col1._0_8_) {
    col0.super_Column_dimension_option.dim_ = 0;
  }
  std::
  _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&col0.column_._M_h,sVar12,
               (EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>
                *)&col3,(key_equal *)&col4,(allocator_type *)local_4a8);
  pp_Var6 = col1.column_._M_h._M_buckets;
  col0.operators_ = (Field_operators *)0x0;
  col0.entryPool_ = (Entry_constructor *)&settings;
  if ((__buckets_ptr)col1._0_8_ != col1.column_._M_h._M_buckets) {
    pp_Var15 = (__buckets_ptr)col1._0_8_;
    do {
      uVar2 = *(undefined4 *)pp_Var15;
      col4._0_8_ = operator_new(4);
      *(undefined4 *)col4._0_8_ = uVar2;
      col3._0_8_ = &col0.column_;
      std::
      _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*>,std::__detail::_Identity,Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,true>>>>
                ((_Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*>,std::__detail::_Identity,Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)col3._0_8_,&col4,&col3);
      pp_Var15 = (__buckets_ptr)((long)pp_Var15 + 4);
    } while (pp_Var15 != pp_Var6);
  }
  if (col1._0_8_ != 0) {
    operator_delete((void *)col1._0_8_,col1.column_._M_h._M_bucket_count - col1._0_8_);
  }
  if (col0.column_._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    pCVar14 = &((matrix->
                super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start)->column_;
    _Var10._M_nxt = col0.column_._M_h._M_before_begin._M_nxt;
    do {
      uVar2 = *(undefined4 *)&(_Var10._M_nxt[1]._M_nxt)->_M_nxt;
      col2._0_8_ = operator_new(4);
      *(undefined4 *)col2._0_8_ = uVar2;
      col1._0_8_ = pCVar14;
      pVar17 = std::
               _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*>,std::__detail::_Identity,Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               ::
               _M_insert<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,true>>>>
                         ((_Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*>,std::__detail::_Identity,Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                           *)pCVar14,&col2,&col1);
      if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        operator_delete((void *)col2._0_8_,4);
        operator_delete(*(void **)((long)pVar17.first.
                                         super__Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_true>
                                         ._M_cur + 8),4);
        std::
        _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::erase(&pCVar14->_M_h,
                (_Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_true>
                 )pVar17.first.
                  super__Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_true>
                  ._M_cur);
      }
      _Var10._M_nxt = (_Var10._M_nxt)->_M_nxt;
    } while (_Var10._M_nxt != (_Hash_node_base *)0x0);
  }
  col1._0_7_ = 0x1000001010000;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_478,&col1);
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x3bf);
  pUVar4 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar11 = ((int)local_468 - (int)local_478) * 8 + local_460;
  if ((int)uVar11 < 0) {
    if ((pUVar4->column_)._M_h._M_element_count != 0) {
      p_Var8 = (pUVar4->column_)._M_h._M_before_begin._M_nxt;
      p_Var5 = p_Var8->_M_nxt;
      for (; p_Var5 != (_Hash_node_base *)0x0; p_Var5 = p_Var5->_M_nxt) {
        p_Var9 = p_Var5;
        if (*(uint *)&(p_Var5[1]._M_nxt)->_M_nxt <= *(uint *)&(p_Var8[1]._M_nxt)->_M_nxt) {
          p_Var9 = p_Var8;
        }
        p_Var8 = p_Var9;
      }
      uVar11 = *(int *)&(p_Var8[1]._M_nxt)->_M_nxt + 1;
      goto LAB_00153199;
    }
    col1.column_._M_h._M_bucket_count = 0;
    col1.column_._M_h._M_before_begin._M_nxt._0_4_ = 0;
    col1.column_._M_h._M_before_begin._M_nxt._4_4_ = 0;
    col1.super_Column_dimension_option.dim_ = 0;
    col1._4_4_ = 0;
    col1.column_._M_h._M_buckets = (__buckets_ptr)0x0;
    col1.column_._M_h._M_element_count = 0;
  }
  else {
LAB_00153199:
    col2._0_8_ = col2._0_8_ & 0xffffffffffffff00;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&col1,(long)(int)uVar11,(bool *)&col2,
               (allocator_type *)&col4);
    for (p_Var8 = (pUVar4->column_)._M_h._M_before_begin._M_nxt; p_Var8 != (_Hash_node_base *)0x0;
        p_Var8 = p_Var8->_M_nxt) {
      uVar3 = *(uint *)&(p_Var8[1]._M_nxt)->_M_nxt;
      if (uVar3 < uVar11) {
        puVar1 = (ulong *)(col1._0_8_ + (ulong)(uVar3 >> 6) * 8);
        *puVar1 = *puVar1 | 1L << ((byte)uVar3 & 0x3f);
      }
    }
  }
  __last1.super__Bit_iterator_base._M_offset = (uint)col1.column_._M_h._M_before_begin._M_nxt;
  __last1.super__Bit_iterator_base._M_p = (_Bit_type *)col1.column_._M_h._M_bucket_count;
  if ((ulong)(uint)col1.column_._M_h._M_before_begin._M_nxt +
      (col1.column_._M_h._M_bucket_count - col1._0_8_) * 8 ==
      (ulong)local_460 + (local_468 - (long)local_478) * 8) {
    __first1.super__Bit_iterator_base._8_8_ = 0;
    __first1.super__Bit_iterator_base._M_p = (_Bit_type *)col1._0_8_;
    __last1.super__Bit_iterator_base._12_4_ = 0;
    __first2.super__Bit_iterator_base._8_8_ = 0;
    __first2.super__Bit_iterator_base._M_p = (_Bit_type *)local_478;
    bVar7 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1,__last1,__first2);
  }
  else {
    bVar7 = false;
  }
  col3.super_Column_dimension_option.dim_._0_1_ = bVar7;
  col3.column_._M_h._M_buckets = (__buckets_ptr)0x0;
  col3.column_._M_h._M_bucket_count._0_4_ = 0;
  col3.column_._M_h._M_bucket_count._4_4_ = 0;
  col4._0_8_ = anon_var_dwarf_62368;
  col4.column_._M_h._M_buckets = (__buckets_ptr)0x18c6bc;
  col2.column_._M_h._M_buckets =
       (__buckets_ptr)((ulong)col2.column_._M_h._M_buckets & 0xffffffffffffff00);
  col2._0_8_ = &PTR__lazy_ostream_001ac7f0;
  col2.column_._M_h._M_bucket_count._0_4_ = 0x1b1120;
  col2.column_._M_h._M_bucket_count._4_4_ = 0;
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  col2.column_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)&col4;
  boost::test_tools::tt_detail::report_assertion(&col3,&col2,&local_60,0x3bf,1,0,0);
  boost::detail::shared_count::~shared_count((shared_count *)&col3.column_._M_h._M_bucket_count);
  if (col1._0_8_ != 0) {
    operator_delete((void *)col1._0_8_,col1.column_._M_h._M_element_count - col1._0_8_);
  }
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x3c1);
  col3.column_._M_h._M_buckets =
       (__buckets_ptr)((ulong)col3.column_._M_h._M_buckets & 0xffffffffffffff00);
  col3._0_8_ = &PTR__lazy_ostream_001ac7b0;
  col3.column_._M_h._M_bucket_count._0_4_ = 0x1b1120;
  col3.column_._M_h._M_bucket_count._4_4_ = 0;
  col3.column_._M_h._M_before_begin._M_nxt._0_4_ = 0x18817b;
  col3.column_._M_h._M_before_begin._M_nxt._4_4_ = 0;
  local_3d0._M_nxt =
       (_Hash_node_base *)
       (((matrix->
         super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start)->column_)._M_h._M_element_count;
  local_448._M_nxt = &local_3d0;
  col4.super_Column_dimension_option.dim_._0_1_ = local_3d0._M_nxt == (_Hash_node_base *)0x3;
  local_358._M_nxt = &local_338;
  local_338._M_nxt._0_4_ = 3;
  col4.column_._M_h._M_buckets = (__buckets_ptr)0x0;
  col4.column_._M_h._M_bucket_count = 0;
  local_4a8 = (undefined1  [8])0x1881fd;
  p_Stack_4a0 = (_Hash_node_base *)0x188270;
  col1.column_._M_h._M_buckets =
       (__buckets_ptr)((ulong)col1.column_._M_h._M_buckets & 0xffffffffffffff00);
  col1._0_8_ = &PTR__lazy_ostream_001ac720;
  col1.column_._M_h._M_bucket_count = (size_type)&boost::unit_test::lazy_ostream::inst;
  col1.column_._M_h._M_before_begin._M_nxt = &local_448;
  col2.column_._M_h._M_before_begin._M_nxt = &local_358;
  col2.column_._M_h._M_buckets =
       (__buckets_ptr)((ulong)col2.column_._M_h._M_buckets & 0xffffffffffffff00);
  col2._0_8_ = &PTR__lazy_ostream_001ac770;
  col2.column_._M_h._M_bucket_count._0_4_ = 0x1b1120;
  col2.column_._M_h._M_bucket_count._4_4_ = 0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count((shared_count *)&col4.column_._M_h._M_bucket_count);
  col3.super_Column_dimension_option.dim_ = 0;
  col3._4_4_ = 1;
  col3.column_._M_h._M_buckets = (__buckets_ptr)0x500000002;
  col3.column_._M_h._M_bucket_count._0_4_ = 6;
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)&col3;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col2,__l_00,
             (allocator_type *)&local_358);
  sVar12 = (long)col2.column_._M_h._M_buckets - col2._0_8_ >> 2;
  CVar13.dim_ = 0;
  if (col2.column_._M_h._M_buckets != (__buckets_ptr)col2._0_8_) {
    CVar13.dim_ = (int)sVar12 + -1;
  }
  col1.super_Column_dimension_option.dim_ = CVar13.dim_;
  std::
  _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&col1.column_._M_h,sVar12,
               (EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>
                *)&col4,(key_equal *)local_4a8,(allocator_type *)&local_448);
  pp_Var6 = col2.column_._M_h._M_buckets;
  col1.operators_ = (Field_operators *)0x0;
  col1.entryPool_ = (Entry_constructor *)&settings;
  if ((__buckets_ptr)col2._0_8_ != col2.column_._M_h._M_buckets) {
    pp_Var15 = (__buckets_ptr)col2._0_8_;
    do {
      uVar2 = *(undefined4 *)pp_Var15;
      local_4a8 = (undefined1  [8])operator_new(4);
      *(undefined4 *)&((_Hash_node_base *)local_4a8)->_M_nxt = uVar2;
      col4._0_8_ = &col1.column_;
      std::
      _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*>,std::__detail::_Identity,Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,true>>>>
                ((_Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*>,std::__detail::_Identity,Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)col4._0_8_,local_4a8,&col4);
      pp_Var15 = (__buckets_ptr)((long)pp_Var15 + 4);
    } while (pp_Var15 != pp_Var6);
  }
  _Var10._M_nxt = col1.column_._M_h._M_before_begin._M_nxt;
  if (col2._0_8_ != 0) {
    operator_delete((void *)col2._0_8_,
                    CONCAT44(col2.column_._M_h._M_bucket_count._4_4_,
                             (undefined4)col2.column_._M_h._M_bucket_count) - col2._0_8_);
    _Var10._M_nxt = col1.column_._M_h._M_before_begin._M_nxt;
  }
  col1.column_._M_h._M_before_begin._M_nxt = _Var10._M_nxt;
  if (_Var10._M_nxt != (_Hash_node_base *)0x0) {
    pCVar14 = &(matrix->
               super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[1].column_;
    do {
      uVar2 = *(undefined4 *)&(_Var10._M_nxt[1]._M_nxt)->_M_nxt;
      col3._0_8_ = operator_new(4);
      *(undefined4 *)col3._0_8_ = uVar2;
      col2._0_8_ = pCVar14;
      pVar17 = std::
               _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*>,std::__detail::_Identity,Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               ::
               _M_insert<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,true>>>>
                         ((_Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*>,std::__detail::_Identity,Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                           *)pCVar14,&col3,&col2);
      if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        operator_delete((void *)col3._0_8_,4);
        operator_delete(*(void **)((long)pVar17.first.
                                         super__Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_true>
                                         ._M_cur + 8),4);
        std::
        _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::erase(&pCVar14->_M_h,
                (_Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_true>
                 )pVar17.first.
                  super__Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_true>
                  ._M_cur);
      }
      _Var10._M_nxt = (_Var10._M_nxt)->_M_nxt;
    } while (_Var10._M_nxt != (_Hash_node_base *)0x0);
  }
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_478,0,0);
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_88 = "";
  local_a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_98 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_90,0x3c8);
  pUVar4 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar11 = ((int)local_468 - (int)local_478) * 8 + local_460;
  if ((int)uVar11 < 0) {
    if (pUVar4[1].column_._M_h._M_element_count != 0) {
      p_Var8 = pUVar4[1].column_._M_h._M_before_begin._M_nxt;
      p_Var5 = p_Var8->_M_nxt;
      for (; p_Var5 != (_Hash_node_base *)0x0; p_Var5 = p_Var5->_M_nxt) {
        p_Var9 = p_Var5;
        if (*(uint *)&(p_Var5[1]._M_nxt)->_M_nxt <= *(uint *)&(p_Var8[1]._M_nxt)->_M_nxt) {
          p_Var9 = p_Var8;
        }
        p_Var8 = p_Var9;
      }
      uVar11 = *(int *)&(p_Var8[1]._M_nxt)->_M_nxt + 1;
      goto LAB_001531fc;
    }
    col2.column_._M_h._M_bucket_count._0_4_ = 0;
    col2.column_._M_h._M_bucket_count._4_4_ = 0;
    col2.column_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    col2.super_Column_dimension_option.dim_ = 0;
    col2._4_4_ = 0;
    col2.column_._M_h._M_buckets = (__buckets_ptr)0x0;
    col2.column_._M_h._M_element_count = 0;
  }
  else {
LAB_001531fc:
    col3._0_8_ = col3._0_8_ & 0xffffffffffffff00;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&col2,(long)(int)uVar11,(bool *)&col3,
               (allocator_type *)local_4a8);
    for (p_Var8 = pUVar4[1].column_._M_h._M_before_begin._M_nxt; p_Var8 != (_Hash_node_base *)0x0;
        p_Var8 = p_Var8->_M_nxt) {
      uVar3 = *(uint *)&(p_Var8[1]._M_nxt)->_M_nxt;
      if (uVar3 < uVar11) {
        puVar1 = (ulong *)(col2._0_8_ + (ulong)(uVar3 >> 6) * 8);
        *puVar1 = *puVar1 | 1L << ((byte)uVar3 & 0x3f);
      }
    }
  }
  __last1_00.super__Bit_iterator_base._M_p._4_4_ = col2.column_._M_h._M_bucket_count._4_4_;
  __last1_00.super__Bit_iterator_base._M_p._0_4_ = (undefined4)col2.column_._M_h._M_bucket_count;
  __last1_00.super__Bit_iterator_base._M_offset = col2.column_._M_h._M_before_begin._M_nxt._0_4_;
  if (((ulong)col2.column_._M_h._M_before_begin._M_nxt & 0xffffffff) +
      (CONCAT44(col2.column_._M_h._M_bucket_count._4_4_,
                (undefined4)col2.column_._M_h._M_bucket_count) - col2._0_8_) * 8 ==
      (ulong)local_460 + (local_468 - (long)local_478) * 8) {
    __first1_00.super__Bit_iterator_base._8_8_ = 0;
    __first1_00.super__Bit_iterator_base._M_p = (_Bit_type *)col2._0_8_;
    __last1_00.super__Bit_iterator_base._12_4_ = 0;
    __first2_00.super__Bit_iterator_base._8_8_ = 0;
    __first2_00.super__Bit_iterator_base._M_p = (_Bit_type *)local_478;
    bVar7 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_00,__last1_00,__first2_00);
  }
  else {
    bVar7 = false;
  }
  col4.super_Column_dimension_option.dim_._0_1_ = bVar7;
  col4.column_._M_h._M_buckets = (__buckets_ptr)0x0;
  col4.column_._M_h._M_bucket_count = 0;
  local_4a8 = (undefined1  [8])0x18c6ce;
  p_Stack_4a0 = (_Hash_node_base *)0x18c6fe;
  col3.column_._M_h._M_buckets =
       (__buckets_ptr)((ulong)col3.column_._M_h._M_buckets & 0xffffffffffffff00);
  col3._0_8_ = &PTR__lazy_ostream_001ac7f0;
  col3.column_._M_h._M_bucket_count._0_4_ = 0x1b1120;
  col3.column_._M_h._M_bucket_count._4_4_ = 0;
  col3.column_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)local_4a8;
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  boost::test_tools::tt_detail::report_assertion(&col4,&col3,&local_b0,0x3c8,1,0,0);
  boost::detail::shared_count::~shared_count((shared_count *)&col4.column_._M_h._M_bucket_count);
  if (col2._0_8_ != 0) {
    operator_delete((void *)col2._0_8_,col2.column_._M_h._M_element_count - col2._0_8_);
  }
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_c0,0x3ca);
  col4.column_._M_h._M_buckets =
       (__buckets_ptr)((ulong)col4.column_._M_h._M_buckets & 0xffffffffffffff00);
  col4._0_8_ = &PTR__lazy_ostream_001ac7b0;
  col4.column_._M_h._M_bucket_count = (size_type)&boost::unit_test::lazy_ostream::inst;
  col4.column_._M_h._M_before_begin._M_nxt._0_4_ = 0x18817b;
  col4.column_._M_h._M_before_begin._M_nxt._4_4_ = 0;
  local_338._M_nxt =
       (_Hash_node_base *)
       (matrix->
       super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start[1].column_._M_h._M_element_count;
  local_3d0._M_nxt = &local_450;
  local_4a8[0] = local_338._M_nxt == (_Hash_node_base *)0x0;
  local_450._M_nxt = (_Hash_node_base *)((ulong)local_450._M_nxt._4_4_ << 0x20);
  p_Stack_4a0 = (_Hash_node_base *)0x0;
  sStack_498.pi_ = (sp_counted_base *)0x0;
  col2.column_._M_h._M_buckets =
       (__buckets_ptr)((ulong)col2.column_._M_h._M_buckets & 0xffffffffffffff00);
  col3.column_._M_h._M_buckets =
       (__buckets_ptr)((ulong)col3.column_._M_h._M_buckets & 0xffffffffffffff00);
  local_448._M_nxt = (_Hash_node_base *)0x1881fd;
  pcStack_440 = "";
  local_358._M_nxt = &local_338;
  col2._0_8_ = &PTR__lazy_ostream_001ac720;
  col2.column_._M_h._M_bucket_count._0_4_ = 0x1b1120;
  col2.column_._M_h._M_bucket_count._4_4_ = 0;
  col2.column_._M_h._M_before_begin._M_nxt = &local_358;
  col3._0_8_ = &PTR__lazy_ostream_001ac770;
  col3.column_._M_h._M_bucket_count._0_4_ = 0x1b1120;
  col3.column_._M_h._M_bucket_count._4_4_ = 0;
  col3.column_._M_h._M_before_begin._M_nxt = &local_3d0;
  boost::test_tools::tt_detail::report_assertion
            ((_Hash_node_base *)local_4a8,&col4,&local_448,0x3ca,1,2,2,"matrix[1].size()",&col2,"0",
             &col3);
  boost::detail::shared_count::~shared_count(&sStack_498);
  col2.super_Column_dimension_option.dim_._0_1_ = 1;
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>
  ::
  multiply_target_and_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>
            ((Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>
              *)((matrix->
                 super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 4),(Field_element *)&col2,&col1);
  col2._0_7_ = 0x1000001010000;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_478,&col2);
  local_e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_d8 = "";
  local_f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_e0,0x3d0);
  pUVar4 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar11 = ((int)local_468 - (int)local_478) * 8 + local_460;
  if ((int)uVar11 < 0) {
    if (pUVar4[4].column_._M_h._M_element_count != 0) {
      p_Var8 = pUVar4[4].column_._M_h._M_before_begin._M_nxt;
      p_Var5 = p_Var8->_M_nxt;
      for (; p_Var5 != (_Hash_node_base *)0x0; p_Var5 = p_Var5->_M_nxt) {
        p_Var9 = p_Var5;
        if (*(uint *)&(p_Var5[1]._M_nxt)->_M_nxt <= *(uint *)&(p_Var8[1]._M_nxt)->_M_nxt) {
          p_Var9 = p_Var8;
        }
        p_Var8 = p_Var9;
      }
      uVar11 = *(int *)&(p_Var8[1]._M_nxt)->_M_nxt + 1;
      goto LAB_0015325e;
    }
    col2.column_._M_h._M_bucket_count._0_4_ = 0;
    col2.column_._M_h._M_bucket_count._4_4_ = 0;
    col2.column_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    col2.super_Column_dimension_option.dim_ = 0;
    col2._4_4_ = 0;
    col2.column_._M_h._M_buckets = (__buckets_ptr)0x0;
    col2.column_._M_h._M_element_count = 0;
  }
  else {
LAB_0015325e:
    col3._0_8_ = col3._0_8_ & 0xffffffffffffff00;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&col2,(long)(int)uVar11,(bool *)&col3,
               (allocator_type *)local_4a8);
    for (p_Var8 = pUVar4[4].column_._M_h._M_before_begin._M_nxt; p_Var8 != (_Hash_node_base *)0x0;
        p_Var8 = p_Var8->_M_nxt) {
      uVar3 = *(uint *)&(p_Var8[1]._M_nxt)->_M_nxt;
      if (uVar3 < uVar11) {
        puVar1 = (ulong *)(col2._0_8_ + (ulong)(uVar3 >> 6) * 8);
        *puVar1 = *puVar1 | 1L << ((byte)uVar3 & 0x3f);
      }
    }
  }
  __last1_01.super__Bit_iterator_base._M_p._4_4_ = col2.column_._M_h._M_bucket_count._4_4_;
  __last1_01.super__Bit_iterator_base._M_p._0_4_ = (undefined4)col2.column_._M_h._M_bucket_count;
  __last1_01.super__Bit_iterator_base._M_offset = col2.column_._M_h._M_before_begin._M_nxt._0_4_;
  if (((ulong)col2.column_._M_h._M_before_begin._M_nxt & 0xffffffff) +
      (CONCAT44(col2.column_._M_h._M_bucket_count._4_4_,
                (undefined4)col2.column_._M_h._M_bucket_count) - col2._0_8_) * 8 ==
      (ulong)local_460 + (local_468 - (long)local_478) * 8) {
    __first1_01.super__Bit_iterator_base._8_8_ = 0;
    __first1_01.super__Bit_iterator_base._M_p = (_Bit_type *)col2._0_8_;
    __last1_01.super__Bit_iterator_base._12_4_ = 0;
    __first2_01.super__Bit_iterator_base._8_8_ = 0;
    __first2_01.super__Bit_iterator_base._M_p = (_Bit_type *)local_478;
    bVar7 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_01,__last1_01,__first2_01);
  }
  else {
    bVar7 = false;
  }
  col4.super_Column_dimension_option.dim_._0_1_ = bVar7;
  col4.column_._M_h._M_buckets = (__buckets_ptr)0x0;
  col4.column_._M_h._M_bucket_count = 0;
  local_4a8 = (undefined1  [8])0x18c710;
  p_Stack_4a0 = (_Hash_node_base *)0x18c740;
  col3.column_._M_h._M_buckets =
       (__buckets_ptr)((ulong)col3.column_._M_h._M_buckets & 0xffffffffffffff00);
  col3._0_8_ = &PTR__lazy_ostream_001ac7f0;
  col3.column_._M_h._M_bucket_count._0_4_ = 0x1b1120;
  col3.column_._M_h._M_bucket_count._4_4_ = 0;
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_f8 = "";
  col3.column_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)local_4a8;
  boost::test_tools::tt_detail::report_assertion(&col4,&col3,&local_100,0x3d0,1,0,0);
  boost::detail::shared_count::~shared_count((shared_count *)&col4.column_._M_h._M_bucket_count);
  if (col2._0_8_ != 0) {
    operator_delete((void *)col2._0_8_,col2.column_._M_h._M_element_count - col2._0_8_);
  }
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_108 = "";
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_110,0x3d2);
  col4.column_._M_h._M_buckets =
       (__buckets_ptr)((ulong)col4.column_._M_h._M_buckets & 0xffffffffffffff00);
  col4._0_8_ = &PTR__lazy_ostream_001ac7b0;
  col4.column_._M_h._M_bucket_count = (size_type)&boost::unit_test::lazy_ostream::inst;
  col4.column_._M_h._M_before_begin._M_nxt._0_4_ = 0x18817b;
  col4.column_._M_h._M_before_begin._M_nxt._4_4_ = 0;
  local_338._M_nxt =
       (_Hash_node_base *)
       (matrix->
       super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start[4].column_._M_h._M_element_count;
  col2.column_._M_h._M_buckets =
       (__buckets_ptr)((ulong)col2.column_._M_h._M_buckets & 0xffffffffffffff00);
  col2._0_8_ = &PTR__lazy_ostream_001ac720;
  col2.column_._M_h._M_bucket_count._0_4_ = 0x1b1120;
  col2.column_._M_h._M_bucket_count._4_4_ = 0;
  col2.column_._M_h._M_before_begin._M_nxt = &local_358;
  local_4a8[0] = local_338._M_nxt == (_Hash_node_base *)0x3;
  local_450._M_nxt._0_4_ = 3;
  p_Stack_4a0 = (_Hash_node_base *)0x0;
  sStack_498.pi_ = (sp_counted_base *)0x0;
  col3.column_._M_h._M_buckets =
       (__buckets_ptr)((ulong)col3.column_._M_h._M_buckets & 0xffffffffffffff00);
  local_448._M_nxt = (_Hash_node_base *)0x1881fd;
  pcStack_440 = "";
  local_358._M_nxt = &local_338;
  local_3d0._M_nxt = &local_450;
  col3._0_8_ = &PTR__lazy_ostream_001ac770;
  col3.column_._M_h._M_bucket_count._0_4_ = 0x1b1120;
  col3.column_._M_h._M_bucket_count._4_4_ = 0;
  col3.column_._M_h._M_before_begin._M_nxt = &local_3d0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_498);
  col2._0_8_ = col2._0_8_ & 0xffffffff00000000;
  std::
  _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&col2.column_._M_h,0,
               (EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>
                *)&col3,(key_equal *)&col4,(allocator_type *)local_4a8);
  col2.operators_ = (Field_operators *)0x0;
  col2.entryPool_ = (Entry_constructor *)&settings;
  if (col2.column_._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0) {
    pCVar14 = &(matrix->
               super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[5].column_;
    _Var10 = col2.column_._M_h._M_before_begin;
    do {
      uVar2 = *(undefined4 *)&(_Var10._M_nxt[1]._M_nxt)->_M_nxt;
      col4._0_8_ = operator_new(4);
      *(undefined4 *)col4._0_8_ = uVar2;
      col3._0_8_ = pCVar14;
      pVar17 = std::
               _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*>,std::__detail::_Identity,Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               ::
               _M_insert<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,true>>>>
                         ((_Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*>,std::__detail::_Identity,Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                           *)pCVar14,&col4,&col3);
      if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        operator_delete((void *)col4._0_8_,4);
        operator_delete(*(void **)((long)pVar17.first.
                                         super__Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_true>
                                         ._M_cur + 8),4);
        std::
        _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::erase(&pCVar14->_M_h,
                (_Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_true>
                 )pVar17.first.
                  super__Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_true>
                  ._M_cur);
      }
      _Var10._M_nxt = (_Var10._M_nxt)->_M_nxt;
    } while (_Var10._M_nxt != (_Hash_node_base *)0x0);
  }
  col3._0_7_ = 0x1010000010101;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_478,&col3);
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x3d8);
  pUVar4 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar11 = ((int)local_468 - (int)local_478) * 8 + local_460;
  if ((int)uVar11 < 0) {
    if (pUVar4[5].column_._M_h._M_element_count != 0) {
      p_Var8 = pUVar4[5].column_._M_h._M_before_begin._M_nxt;
      p_Var5 = p_Var8->_M_nxt;
      for (; p_Var5 != (_Hash_node_base *)0x0; p_Var5 = p_Var5->_M_nxt) {
        p_Var9 = p_Var5;
        if (*(uint *)&(p_Var5[1]._M_nxt)->_M_nxt <= *(uint *)&(p_Var8[1]._M_nxt)->_M_nxt) {
          p_Var9 = p_Var8;
        }
        p_Var8 = p_Var9;
      }
      uVar11 = *(int *)&(p_Var8[1]._M_nxt)->_M_nxt + 1;
      goto LAB_001532c2;
    }
    col3.column_._M_h._M_bucket_count._0_4_ = 0;
    col3.column_._M_h._M_bucket_count._4_4_ = 0;
    col3.column_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    col3.super_Column_dimension_option.dim_ = 0;
    col3._4_4_ = 0;
    col3.column_._M_h._M_buckets = (__buckets_ptr)0x0;
    col3.column_._M_h._M_element_count = 0;
  }
  else {
LAB_001532c2:
    col4._0_8_ = col4._0_8_ & 0xffffffffffffff00;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&col3,(long)(int)uVar11,(bool *)&col4,
               (allocator_type *)&local_448);
    for (p_Var8 = pUVar4[5].column_._M_h._M_before_begin._M_nxt; p_Var8 != (_Hash_node_base *)0x0;
        p_Var8 = p_Var8->_M_nxt) {
      uVar3 = *(uint *)&(p_Var8[1]._M_nxt)->_M_nxt;
      if (uVar3 < uVar11) {
        puVar1 = (ulong *)(col3._0_8_ + (ulong)(uVar3 >> 6) * 8);
        *puVar1 = *puVar1 | 1L << ((byte)uVar3 & 0x3f);
      }
    }
  }
  __last1_02.super__Bit_iterator_base._M_p._4_4_ = col3.column_._M_h._M_bucket_count._4_4_;
  __last1_02.super__Bit_iterator_base._M_p._0_4_ = (undefined4)col3.column_._M_h._M_bucket_count;
  __last1_02.super__Bit_iterator_base._M_offset = col3.column_._M_h._M_before_begin._M_nxt._0_4_;
  if (((ulong)col3.column_._M_h._M_before_begin._M_nxt & 0xffffffff) +
      (CONCAT44(col3.column_._M_h._M_bucket_count._4_4_,
                (undefined4)col3.column_._M_h._M_bucket_count) - col3._0_8_) * 8 ==
      (ulong)local_460 + (local_468 - (long)local_478) * 8) {
    __first1_02.super__Bit_iterator_base._8_8_ = 0;
    __first1_02.super__Bit_iterator_base._M_p = (_Bit_type *)col3._0_8_;
    __last1_02.super__Bit_iterator_base._12_4_ = 0;
    __first2_02.super__Bit_iterator_base._8_8_ = 0;
    __first2_02.super__Bit_iterator_base._M_p = (_Bit_type *)local_478;
    bVar7 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_02,__last1_02,__first2_02);
  }
  else {
    bVar7 = false;
  }
  local_4a8[0] = bVar7;
  p_Stack_4a0 = (_Hash_node_base *)0x0;
  sStack_498.pi_ = (sp_counted_base *)0x0;
  local_448._M_nxt = (_Hash_node_base *)0x18c752;
  pcStack_440 = "";
  col4.column_._M_h._M_buckets =
       (__buckets_ptr)((ulong)col4.column_._M_h._M_buckets & 0xffffffffffffff00);
  col4._0_8_ = &PTR__lazy_ostream_001ac7f0;
  col4.column_._M_h._M_bucket_count = (size_type)&boost::unit_test::lazy_ostream::inst;
  col4.column_._M_h._M_before_begin._M_nxt = &local_448;
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_148 = "";
  boost::test_tools::tt_detail::report_assertion(local_4a8,&col4,&local_150,0x3d8,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_498);
  if (col3._0_8_ != 0) {
    operator_delete((void *)col3._0_8_,col3.column_._M_h._M_element_count - col3._0_8_);
  }
  local_160 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_158 = "";
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_160,0x3da);
  p_Stack_4a0 = (_Hash_node_base *)((ulong)p_Stack_4a0 & 0xffffffffffffff00);
  local_4a8 = (undefined1  [8])&PTR__lazy_ostream_001ac7b0;
  sStack_498.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_490._0_4_ = 0x18817b;
  local_490._4_4_ = 0;
  local_450._M_nxt =
       (_Hash_node_base *)
       (matrix->
       super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start[5].column_._M_h._M_element_count;
  col3.column_._M_h._M_buckets =
       (__buckets_ptr)((ulong)col3.column_._M_h._M_buckets & 0xffffffffffffff00);
  col3._0_8_ = &PTR__lazy_ostream_001ac720;
  col3.column_._M_h._M_bucket_count._0_4_ = 0x1b1120;
  col3.column_._M_h._M_bucket_count._4_4_ = 0;
  col3.column_._M_h._M_before_begin._M_nxt = &local_3d0;
  local_448._M_nxt._0_1_ = local_450._M_nxt == (_Hash_node_base *)0x5;
  col4.column_._M_h._M_buckets =
       (__buckets_ptr)((ulong)col4.column_._M_h._M_buckets & 0xffffffffffffff00);
  local_338._M_nxt = &local_2d0;
  local_2d0._M_nxt._0_4_ = 5;
  pcStack_440 = (char *)0x0;
  sStack_438.pi_ = (sp_counted_base *)0x0;
  col4._0_8_ = &PTR__lazy_ostream_001ac770;
  col4.column_._M_h._M_bucket_count = (size_type)&boost::unit_test::lazy_ostream::inst;
  col4.column_._M_h._M_before_begin._M_nxt = &local_338;
  local_358._M_nxt = (_Hash_node_base *)0x1881fd;
  local_350 = "";
  local_3d0._M_nxt = &local_450;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_438);
  local_4a8 = (undefined1  [8])0x300000002;
  p_Stack_4a0 = (_Hash_node_base *)CONCAT44(p_Stack_4a0._4_4_,6);
  __l_01._M_len = 3;
  __l_01._M_array = (iterator)local_4a8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&col4,__l_01,
             (allocator_type *)&local_338);
  sVar12 = (long)col4.column_._M_h._M_buckets - col4._0_8_ >> 2;
  CVar13.dim_ = 0;
  if (col4.column_._M_h._M_buckets != (__buckets_ptr)col4._0_8_) {
    CVar13.dim_ = (int)sVar12 + -1;
  }
  col3.super_Column_dimension_option.dim_ = CVar13.dim_;
  std::
  _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&col3.column_._M_h,sVar12,
               (EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>
                *)&local_448,(key_equal *)&local_358,(allocator_type *)&local_3d0);
  pp_Var6 = col4.column_._M_h._M_buckets;
  col3.operators_ = (Field_operators *)0x0;
  col3.entryPool_ = (Entry_constructor *)&settings;
  if ((__buckets_ptr)col4._0_8_ != col4.column_._M_h._M_buckets) {
    pp_Var15 = (__buckets_ptr)col4._0_8_;
    do {
      uVar2 = *(undefined4 *)pp_Var15;
      local_358._M_nxt = (_Hash_node_base *)operator_new(4);
      *(undefined4 *)&(local_358._M_nxt)->_M_nxt = uVar2;
      local_448._M_nxt = (_Hash_node_base *)&col3.column_;
      std::
      _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*>,std::__detail::_Identity,Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,true>>>>
                ((_Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*>,std::__detail::_Identity,Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)local_448._M_nxt,&local_358,&local_448);
      pp_Var15 = (__buckets_ptr)((long)pp_Var15 + 4);
    } while (pp_Var15 != pp_Var6);
  }
  _Var10._M_nxt = col3.column_._M_h._M_before_begin._M_nxt;
  if (col4._0_8_ != 0) {
    operator_delete((void *)col4._0_8_,col4.column_._M_h._M_bucket_count - col4._0_8_);
    _Var10._M_nxt = col3.column_._M_h._M_before_begin._M_nxt;
  }
  col3.column_._M_h._M_before_begin._M_nxt = _Var10._M_nxt;
  if (_Var10._M_nxt != (_Hash_node_base *)0x0) {
    pCVar14 = &(matrix->
               super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start[5].column_;
    do {
      uVar2 = *(undefined4 *)&(_Var10._M_nxt[1]._M_nxt)->_M_nxt;
      local_4a8 = (undefined1  [8])operator_new(4);
      *(undefined4 *)&((_Hash_node_base *)local_4a8)->_M_nxt = uVar2;
      col4._0_8_ = pCVar14;
      pVar17 = std::
               _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*>,std::__detail::_Identity,Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
               ::
               _M_insert<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,true>>>>
                         ((_Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*>,std::__detail::_Identity,Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                           *)pCVar14,local_4a8,&col4);
      if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        operator_delete((void *)local_4a8,4);
        operator_delete(*(void **)((long)pVar17.first.
                                         super__Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_true>
                                         ._M_cur + 8),4);
        std::
        _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
        ::erase(&pCVar14->_M_h,
                (_Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_true>
                 )pVar17.first.
                  super__Node_iterator_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_true>
                  ._M_cur);
      }
      _Var10._M_nxt = (_Var10._M_nxt)->_M_nxt;
    } while (_Var10._M_nxt != (_Hash_node_base *)0x0);
  }
  col4._0_7_ = 0x10001000101;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_478,&col4);
  local_180 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_180,0x3e0);
  pUVar4 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar11 = ((int)local_468 - (int)local_478) * 8 + local_460;
  if ((int)uVar11 < 0) {
    if (pUVar4[5].column_._M_h._M_element_count != 0) {
      p_Var8 = pUVar4[5].column_._M_h._M_before_begin._M_nxt;
      p_Var5 = p_Var8->_M_nxt;
      for (; p_Var5 != (_Hash_node_base *)0x0; p_Var5 = p_Var5->_M_nxt) {
        p_Var9 = p_Var5;
        if (*(uint *)&(p_Var5[1]._M_nxt)->_M_nxt <= *(uint *)&(p_Var8[1]._M_nxt)->_M_nxt) {
          p_Var9 = p_Var8;
        }
        p_Var8 = p_Var9;
      }
      uVar11 = *(int *)&(p_Var8[1]._M_nxt)->_M_nxt + 1;
      goto LAB_00153327;
    }
    col4.column_._M_h._M_bucket_count = 0;
    col4.column_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    col4.super_Column_dimension_option.dim_ = 0;
    col4._4_4_ = 0;
    col4.column_._M_h._M_buckets = (__buckets_ptr)0x0;
    col4.column_._M_h._M_element_count = 0;
  }
  else {
LAB_00153327:
    local_4a8 = (undefined1  [8])((ulong)local_4a8 & 0xffffffffffffff00);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&col4,(long)(int)uVar11,(bool *)local_4a8,
               (allocator_type *)&local_358);
    for (p_Var8 = pUVar4[5].column_._M_h._M_before_begin._M_nxt; p_Var8 != (_Hash_node_base *)0x0;
        p_Var8 = p_Var8->_M_nxt) {
      uVar3 = *(uint *)&(p_Var8[1]._M_nxt)->_M_nxt;
      if (uVar3 < uVar11) {
        puVar1 = (ulong *)(col4._0_8_ + (ulong)(uVar3 >> 6) * 8);
        *puVar1 = *puVar1 | 1L << ((byte)uVar3 & 0x3f);
      }
    }
  }
  __last1_03.super__Bit_iterator_base._M_offset = col4.column_._M_h._M_before_begin._M_nxt._0_4_;
  __last1_03.super__Bit_iterator_base._M_p = (_Bit_type *)col4.column_._M_h._M_bucket_count;
  if (((ulong)col4.column_._M_h._M_before_begin._M_nxt & 0xffffffff) +
      (col4.column_._M_h._M_bucket_count - col4._0_8_) * 8 ==
      (ulong)local_460 + (local_468 - (long)local_478) * 8) {
    __first1_03.super__Bit_iterator_base._8_8_ = 0;
    __first1_03.super__Bit_iterator_base._M_p = (_Bit_type *)col4._0_8_;
    __last1_03.super__Bit_iterator_base._12_4_ = 0;
    __first2_03.super__Bit_iterator_base._8_8_ = 0;
    __first2_03.super__Bit_iterator_base._M_p = (_Bit_type *)local_478;
    bVar7 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_03,__last1_03,__first2_03);
  }
  else {
    bVar7 = false;
  }
  local_448._M_nxt._0_1_ = bVar7;
  pcStack_440 = (char *)0x0;
  sStack_438.pi_ = (sp_counted_base *)0x0;
  local_358._M_nxt = (_Hash_node_base *)0x18c752;
  local_350 = "";
  p_Stack_4a0 = (_Hash_node_base *)((ulong)p_Stack_4a0 & 0xffffffffffffff00);
  local_4a8 = (undefined1  [8])&PTR__lazy_ostream_001ac7f0;
  sStack_498.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_490 = &local_358;
  local_1a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_198 = "";
  boost::test_tools::tt_detail::report_assertion(&local_448,local_4a8,&local_1a0,0x3e0,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_438);
  if (col4._0_8_ != 0) {
    operator_delete((void *)col4._0_8_,col4.column_._M_h._M_element_count - col4._0_8_);
  }
  local_1b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1a8 = "";
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b0,0x3e2);
  pcStack_440 = (char *)((ulong)pcStack_440 & 0xffffffffffffff00);
  local_448._M_nxt = (_Hash_node_base *)&PTR__lazy_ostream_001ac7b0;
  sStack_438.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_430 = (_Hash_node_base *)0x18817b;
  local_2d0._M_nxt =
       (_Hash_node_base *)
       (matrix->
       super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start[5].column_._M_h._M_element_count;
  col4.column_._M_h._M_buckets =
       (__buckets_ptr)((ulong)col4.column_._M_h._M_buckets & 0xffffffffffffff00);
  col4._0_8_ = &PTR__lazy_ostream_001ac720;
  col4.column_._M_h._M_bucket_count = (size_type)&boost::unit_test::lazy_ostream::inst;
  col4.column_._M_h._M_before_begin._M_nxt = &local_338;
  local_358._M_nxt._0_1_ = local_2d0._M_nxt == (_Hash_node_base *)0x4;
  p_Stack_4a0 = (_Hash_node_base *)((ulong)p_Stack_4a0 & 0xffffffffffffff00);
  local_450._M_nxt = &local_270;
  local_270._M_nxt._0_4_ = 4;
  local_350 = (char *)0x0;
  sStack_348.pi_ = (sp_counted_base *)0x0;
  local_4a8 = (undefined1  [8])&PTR__lazy_ostream_001ac770;
  sStack_498.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_490 = &local_450;
  local_3d0._M_nxt = (_Hash_node_base *)0x1881fd;
  local_3c8 = "";
  local_338._M_nxt = &local_2d0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_348);
  local_448._M_nxt = (_Hash_node_base *)0x100000000;
  pcStack_440 = (char *)0x500000003;
  __l_02._M_len = 4;
  __l_02._M_array = (iterator)&local_448;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_4a8,__l_02,
             (allocator_type *)&local_450);
  sVar12 = (long)p_Stack_4a0 - (long)local_4a8 >> 2;
  CVar13.dim_ = 0;
  if ((undefined1  [8])p_Stack_4a0 != local_4a8) {
    CVar13.dim_ = (int)sVar12 + -1;
  }
  pCVar14 = &col4.column_;
  col4.super_Column_dimension_option.dim_ = CVar13.dim_;
  std::
  _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable(&pCVar14->_M_h,sVar12,
               (EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>
                *)&local_358,(key_equal *)&local_3d0,(allocator_type *)&local_338);
  p_Var8 = p_Stack_4a0;
  col4.operators_ = (Field_operators *)0x0;
  col4.entryPool_ = (Entry_constructor *)&settings;
  if (local_4a8 != (undefined1  [8])p_Stack_4a0) {
    auVar16 = local_4a8;
    do {
      uVar2 = *(undefined4 *)&((_Hash_node_base *)auVar16)->_M_nxt;
      local_3d0._M_nxt = (_Hash_node_base *)operator_new(4);
      *(undefined4 *)&(local_3d0._M_nxt)->_M_nxt = uVar2;
      local_358._M_nxt = (_Hash_node_base *)pCVar14;
      std::
      _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*>,std::__detail::_Identity,Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,true>>>>
                ((_Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>*>,std::__detail::_Identity,Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)pCVar14,&local_3d0,&local_358);
      auVar16 = (undefined1  [8])((long)&((_Hash_node_base *)auVar16)->_M_nxt + 4);
    } while (auVar16 != (undefined1  [8])p_Var8);
  }
  if (local_4a8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_4a8,(long)sStack_498.pi_ - (long)local_4a8);
  }
  local_4a8[0] = 1;
  Gudhi::persistence_matrix::
  Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>
  ::
  multiply_target_and_add<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>>
            ((Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,(Gudhi::persistence_matrix::Column_types)6,false,false,false>>>
              *)((matrix->
                 super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start + 3),(Field_element *)local_4a8,&col4);
  local_4a8._0_7_ = 0x10001000101;
  std::vector<bool,std::allocator<bool>>::_M_assign_aux<bool_const*>
            ((vector<bool,std::allocator<bool>> *)&local_478,local_4a8);
  local_1d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1c8 = "";
  local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d0,1000);
  pUVar4 = (matrix->
           super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar11 = ((int)local_468 - (int)local_478) * 8 + local_460;
  if ((int)uVar11 < 0) {
    if (pUVar4[3].column_._M_h._M_element_count == 0) {
      sStack_498.pi_ = (sp_counted_base *)0x0;
      local_490 = (_Hash_node_base *)0x0;
      local_4a8 = (undefined1  [8])0x0;
      p_Stack_4a0 = (_Hash_node_base *)0x0;
      local_488 = (_Bit_pointer)0x0;
      goto LAB_00152e44;
    }
    p_Var8 = pUVar4[3].column_._M_h._M_before_begin._M_nxt;
    p_Var5 = p_Var8->_M_nxt;
    for (; p_Var5 != (_Hash_node_base *)0x0; p_Var5 = p_Var5->_M_nxt) {
      p_Var9 = p_Var5;
      if (*(uint *)&(p_Var5[1]._M_nxt)->_M_nxt <= *(uint *)&(p_Var8[1]._M_nxt)->_M_nxt) {
        p_Var9 = p_Var8;
      }
      p_Var8 = p_Var9;
    }
    uVar11 = *(int *)&(p_Var8[1]._M_nxt)->_M_nxt + 1;
  }
  local_448._M_nxt = local_448._M_nxt & 0xffffffffffffff00;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)local_4a8,(long)(int)uVar11,(bool *)&local_448,
             (allocator_type *)&local_3d0);
  for (p_Var8 = pUVar4[3].column_._M_h._M_before_begin._M_nxt; p_Var8 != (_Hash_node_base *)0x0;
      p_Var8 = p_Var8->_M_nxt) {
    uVar3 = *(uint *)&(p_Var8[1]._M_nxt)->_M_nxt;
    if (uVar3 < uVar11) {
      ((_Hash_node_base *)((long)local_4a8 + (ulong)(uVar3 >> 6) * 8))->_M_nxt =
           (_Hash_node_base *)
           ((ulong)((_Hash_node_base *)((long)local_4a8 + (ulong)(uVar3 >> 6) * 8))->_M_nxt |
           1L << ((byte)uVar3 & 0x3f));
    }
  }
LAB_00152e44:
  __last1_04.super__Bit_iterator_base._M_offset = (uint)local_490;
  __last1_04.super__Bit_iterator_base._M_p = (_Bit_type *)sStack_498.pi_;
  if (((ulong)local_490 & 0xffffffff) + ((long)sStack_498.pi_ - (long)local_4a8) * 8 ==
      (ulong)local_460 + (local_468 - (long)local_478) * 8) {
    __first1_04.super__Bit_iterator_base._8_8_ = 0;
    __first1_04.super__Bit_iterator_base._M_p = (_Bit_type *)local_4a8;
    __last1_04.super__Bit_iterator_base._12_4_ = 0;
    __first2_04.super__Bit_iterator_base._8_8_ = 0;
    __first2_04.super__Bit_iterator_base._M_p = (_Bit_type *)local_478;
    bVar7 = std::__equal<false>::equal<std::_Bit_const_iterator,std::_Bit_const_iterator>
                      (__first1_04,__last1_04,__first2_04);
  }
  else {
    bVar7 = false;
  }
  local_358._M_nxt._0_1_ = bVar7;
  local_350 = (char *)0x0;
  sStack_348.pi_ = (sp_counted_base *)0x0;
  local_3d0._M_nxt = (_Hash_node_base *)0x18c798;
  local_3c8 = "";
  pcStack_440 = (char *)((ulong)pcStack_440 & 0xffffffffffffff00);
  local_448._M_nxt = (_Hash_node_base *)&PTR__lazy_ostream_001ac7f0;
  sStack_438.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_430 = &local_3d0;
  local_1f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1e8 = "";
  boost::test_tools::tt_detail::report_assertion(&local_358,&local_448,&local_1f0,1000,1,0,0);
  boost::detail::shared_count::~shared_count(&sStack_348);
  if (local_4a8 != (undefined1  [8])0x0) {
    operator_delete((void *)local_4a8,(long)local_488 - (long)local_4a8);
  }
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_1f8 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_200,0x3ea);
  local_350 = (char *)((ulong)local_350 & 0xffffffffffffff00);
  local_358._M_nxt = (_Hash_node_base *)&PTR__lazy_ostream_001ac7b0;
  sStack_348.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_340 = "";
  local_270._M_nxt =
       (_Hash_node_base *)
       (matrix->
       super__Vector_base<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Unordered_set_column<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start[3].column_._M_h._M_element_count;
  local_2d0._M_nxt = (_Hash_node_base *)local_264;
  local_3d0._M_nxt._0_1_ = local_270._M_nxt == (_Hash_node_base *)0x4;
  local_264 = (undefined1  [4])0x4;
  local_3c8 = (char *)0x0;
  sStack_3c0.pi_ = (sp_counted_base *)0x0;
  local_338._M_nxt = (_Hash_node_base *)0x1881fd;
  local_330 = "";
  local_450._M_nxt = &local_270;
  p_Stack_4a0 = (_Hash_node_base *)((ulong)p_Stack_4a0 & 0xffffffffffffff00);
  local_4a8 = (undefined1  [8])&PTR__lazy_ostream_001ac720;
  sStack_498.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_490 = &local_450;
  pcStack_440 = (char *)((ulong)pcStack_440 & 0xffffffffffffff00);
  local_448._M_nxt = (_Hash_node_base *)&PTR__lazy_ostream_001ac770;
  sStack_438.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_430 = &local_2d0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_3c0);
  for (_Var10 = col4.column_._M_h._M_before_begin; _Var10._M_nxt != (_Hash_node_base *)0x0;
      _Var10._M_nxt = (_Var10._M_nxt)->_M_nxt) {
    operator_delete(_Var10._M_nxt[1]._M_nxt,4);
  }
  std::
  _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&pCVar14->_M_h);
  for (_Var10._M_nxt = col3.column_._M_h._M_before_begin._M_nxt;
      _Var10._M_nxt != (_Hash_node_base *)0x0; _Var10._M_nxt = (_Var10._M_nxt)->_M_nxt) {
    operator_delete(_Var10._M_nxt[1]._M_nxt,4);
  }
  std::
  _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&col3.column_._M_h);
  for (_Var10._M_nxt = col2.column_._M_h._M_before_begin._M_nxt;
      _Var10._M_nxt != (_Hash_node_base *)0x0; _Var10._M_nxt = (_Var10._M_nxt)->_M_nxt) {
    operator_delete(_Var10._M_nxt[1]._M_nxt,4);
  }
  std::
  _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&col2.column_._M_h);
  for (_Var10._M_nxt = col1.column_._M_h._M_before_begin._M_nxt;
      _Var10._M_nxt != (_Hash_node_base *)0x0; _Var10._M_nxt = (_Var10._M_nxt)->_M_nxt) {
    operator_delete(_Var10._M_nxt[1]._M_nxt,4);
  }
  std::
  _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&col1.column_._M_h);
  for (; col0.column_._M_h._M_before_begin._M_nxt != (_Hash_node_base *)0x0;
      col0.column_._M_h._M_before_begin._M_nxt = (col0.column_._M_h._M_before_begin._M_nxt)->_M_nxt)
  {
    operator_delete(col0.column_._M_h._M_before_begin._M_nxt[1]._M_nxt,4);
  }
  std::
  _Hashtable<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_*>,_std::__detail::_Identity,_Gudhi::persistence_matrix::EntryPointerEq<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_Gudhi::persistence_matrix::EntryPointerHash<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Boundary_col_options<true,_(Gudhi::persistence_matrix::Column_types)6,_false,_false,_false>_>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&col0.column_._M_h);
  if (local_478 != (void *)0x0) {
    operator_delete(local_478,local_458 - (long)local_478);
  }
  return;
}

Assistant:

void column_test_boundary_z2_operators(std::vector<Column>& matrix) {
  using cont = std::vector<unsigned int>;

  std::vector<bool> veccont;
  typename Column::Column_settings settings;

  const Column col0(cont{0, 1, 2, 5, 6}, &settings);
  matrix[0] += col0;

  veccont = {0, 0, 1, 1, 0, 0, 1};
  BOOST_CHECK(matrix[0].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[0].size(), 3);
  }

  const Column col1(cont{0, 1, 2, 5, 6}, &settings);
  matrix[1] += col1;

  veccont = {};
  BOOST_CHECK(matrix[1].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[1].size(), 0);
  }

  // this = v * this + column
  matrix[4].multiply_target_and_add(3, col1);
  veccont = {0, 0, 1, 1, 0, 0, 1};
  BOOST_CHECK(matrix[4].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[4].size(), 3);
  }
  // this = this + column * v
  const Column col2(cont{}, &settings);
  matrix[5].multiply_source_and_add(col2, 3);
  veccont = {1, 1, 1, 0, 0, 1, 1};
  BOOST_CHECK(matrix[5].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[5].size(), 5);
  }
  // this = this + column * v
  const Column col3(cont{2, 3, 6}, &settings);
  matrix[5].multiply_source_and_add(col3, 3);
  veccont = {1, 1, 0, 1, 0, 1, 0};
  BOOST_CHECK(matrix[5].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[5].size(), 4);
  }
  // this = v * this + column
  const Column col4(cont{0, 1, 3, 5}, &settings);
  matrix[3].multiply_target_and_add(4, col4);
  veccont = {1, 1, 0, 1, 0, 1, 0};
  BOOST_CHECK(matrix[3].get_content(veccont.size()) == veccont);
  if constexpr (Column::Master::Option_list::column_type != Column_types::HEAP) {
    BOOST_CHECK_EQUAL(matrix[3].size(), 4);
  }
}